

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O3

void __thiscall
cornelich::excerpt_appender::excerpt_appender(excerpt_appender *this,vanilla_chronicle *chronicle)

{
  this->m_chronicle = chronicle;
  (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>)0x0;
  *(undefined4 *)&this->m_index = 0xffffffff;
  *(undefined4 *)((long)&this->m_index + 4) = 0xffffffff;
  this->m_last_cycle = -1;
  this->m_last_index_file_number = -1;
  this->m_last_thread_id = -1;
  this->m_last_data_file_number = -1;
  this->m_finished = true;
  this->m_last_written_index = -1;
  (this->m_buffer).m_index = &this->m_index;
  return;
}

Assistant:

excerpt_appender::excerpt_appender(vanilla_chronicle & chronicle)
    : m_chronicle(chronicle)
    , m_index(-1)
    , m_last_cycle(-1)
    , m_last_index_file_number(-1)
    , m_last_thread_id(-1)
    , m_last_data_file_number(-1)
    , m_finished(true)
    , m_buffer(m_index)
{
}